

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteBlock.h
# Opt level: O2

void __thiscall Js::ByteBlock::ByteBlock(ByteBlock *this,uint size,Recycler *alloc)

{
  Recycler *this_00;
  uchar *ptr;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  this->m_contentSize = size;
  (this->m_content).ptr = (uchar *)0x0;
  local_40 = (undefined1  [8])&unsigned_char::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_3450766;
  data.filename._0_4_ = 0x1d;
  data.plusSize = (ulong)size;
  this_00 = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_40);
  ptr = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                  ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)size);
  Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierSet(&this->m_content,ptr);
  return;
}

Assistant:

ByteBlock(uint size, Recycler *alloc) : m_contentSize(size), m_content(nullptr)
        {
            // The New function below will copy over a buffer into this so
            // we don't need to zero it out
            m_content = RecyclerNewArrayLeaf(alloc, byte, size);
        }